

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLUtil.cpp
# Opt level: O0

bool eglu::configMatches(Library *egl,EGLDisplay display,EGLConfig eglConfig,
                        RenderConfig *renderConfig)

{
  SurfaceType SVar1;
  deUint32 dVar2;
  deBool dVar3;
  int local_4c;
  int local_48;
  EGLint value;
  int attribNdx;
  EGLint requiredSurface;
  EGLint surfaceType;
  uint local_34;
  EGLint requiredRenderable;
  EGLint renderableType;
  RenderConfig *renderConfig_local;
  EGLConfig eglConfig_local;
  EGLDisplay display_local;
  Library *egl_local;
  
  local_34 = 0;
  _requiredRenderable = renderConfig;
  renderConfig_local = (RenderConfig *)eglConfig;
  eglConfig_local = display;
  display_local = egl;
  requiredSurface = (EGLint)glu::ContextType::getAPI(&renderConfig->type);
  surfaceType = apiRenderableType((ApiType)requiredSurface);
  do {
    (**(code **)(*display_local + 200))
              (display_local,eglConfig_local,renderConfig_local,0x3040,&local_34);
    dVar2 = (**(code **)(*display_local + 0xf8))();
    checkError(dVar2,"getConfigAttrib(display, eglConfig, EGL_RENDERABLE_TYPE, &renderableType)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
               ,0xc4);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  if ((local_34 & surfaceType) == 0) {
    egl_local._7_1_ = false;
  }
  else {
    if (_requiredRenderable->surfaceType != SURFACETYPE_DONT_CARE) {
      attribNdx = 0;
      value = 0;
      SVar1 = _requiredRenderable->surfaceType;
      if (SVar1 == SURFACETYPE_WINDOW) {
        value = 4;
      }
      else if (SVar1 == SURFACETYPE_OFFSCREEN_NATIVE) {
        value = 2;
      }
      else if (SVar1 == SURFACETYPE_OFFSCREEN_GENERIC) {
        value = 1;
      }
      do {
        (**(code **)(*display_local + 200))
                  (display_local,eglConfig_local,renderConfig_local,0x3033,&attribNdx);
        dVar2 = (**(code **)(*display_local + 0xf8))();
        checkError(dVar2,"getConfigAttrib(display, eglConfig, EGL_SURFACE_TYPE, &surfaceType)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                   ,0xd8);
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
      if ((attribNdx & value) == 0) {
        return false;
      }
    }
    for (local_48 = 0; local_48 < 8; local_48 = local_48 + 1) {
      if (*(int *)((long)&(_requiredRenderable->type).super_ApiType.m_bits +
                  configMatches::s_attribs[local_48].field) != -1) {
        local_4c = 0;
        do {
          (**(code **)(*display_local + 200))
                    (display_local,eglConfig_local,renderConfig_local,
                     configMatches::s_attribs[local_48].attrib,&local_4c);
          dVar2 = (**(code **)(*display_local + 0xf8))();
          checkError(dVar2,
                     "getConfigAttrib(display, eglConfig, s_attribs[attribNdx].attrib, &value)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                     ,0xf4);
          dVar3 = ::deGetFalse();
        } while (dVar3 != 0);
        if (local_4c !=
            *(int *)((long)&(_requiredRenderable->type).super_ApiType.m_bits +
                    configMatches::s_attribs[local_48].field)) {
          return false;
        }
      }
    }
    egl_local._7_1_ = true;
  }
  return egl_local._7_1_;
}

Assistant:

static bool configMatches (const eglw::Library& egl, eglw::EGLDisplay display, eglw::EGLConfig eglConfig, const glu::RenderConfig& renderConfig)
{
	// \todo [2014-03-12 pyry] Check other attributes like double-buffer bit.

	{
		EGLint		renderableType		= 0;
		EGLint		requiredRenderable	= apiRenderableType(renderConfig.type.getAPI());

		EGLU_CHECK_CALL(egl, getConfigAttrib(display, eglConfig, EGL_RENDERABLE_TYPE, &renderableType));

		if ((renderableType & requiredRenderable) == 0)
			return false;
	}

	if (renderConfig.surfaceType != glu::RenderConfig::SURFACETYPE_DONT_CARE)
	{
		EGLint		surfaceType		= 0;
		EGLint		requiredSurface	= 0;

		switch (renderConfig.surfaceType)
		{
			case glu::RenderConfig::SURFACETYPE_WINDOW:				requiredSurface = EGL_WINDOW_BIT;	break;
			case glu::RenderConfig::SURFACETYPE_OFFSCREEN_NATIVE:	requiredSurface = EGL_PIXMAP_BIT;	break;
			case glu::RenderConfig::SURFACETYPE_OFFSCREEN_GENERIC:	requiredSurface = EGL_PBUFFER_BIT;	break;
			default:
				DE_ASSERT(false);
		}

		EGLU_CHECK_CALL(egl, getConfigAttrib(display, eglConfig, EGL_SURFACE_TYPE, &surfaceType));

		if ((surfaceType & requiredSurface) == 0)
			return false;
	}

	{
		static const struct
		{
			int	glu::RenderConfig::*field;
			EGLint attrib;
		} s_attribs[] =
		{
			{ &glu::RenderConfig::id,			EGL_CONFIG_ID		},
			{ &glu::RenderConfig::redBits,		EGL_RED_SIZE		},
			{ &glu::RenderConfig::greenBits,	EGL_GREEN_SIZE		},
			{ &glu::RenderConfig::blueBits,		EGL_BLUE_SIZE		},
			{ &glu::RenderConfig::alphaBits,	EGL_ALPHA_SIZE		},
			{ &glu::RenderConfig::depthBits,	EGL_DEPTH_SIZE		},
			{ &glu::RenderConfig::stencilBits,	EGL_STENCIL_SIZE	},
			{ &glu::RenderConfig::numSamples,	EGL_SAMPLES			},
		};

		for (int attribNdx = 0; attribNdx < DE_LENGTH_OF_ARRAY(s_attribs); attribNdx++)
		{
			if (renderConfig.*s_attribs[attribNdx].field != glu::RenderConfig::DONT_CARE)
			{
				EGLint value = 0;
				EGLU_CHECK_CALL(egl, getConfigAttrib(display, eglConfig, s_attribs[attribNdx].attrib, &value));
				if (value != renderConfig.*s_attribs[attribNdx].field)
					return false;
			}
		}
	}

	return true;
}